

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::CustomOptions_MessageOptionThreeFieldsSet_Test::TestBody
          (CustomOptions_MessageOptionThreeFieldsSet_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  MessageLite *pMVar3;
  Nonnull<const_char_*> failure_msg;
  Message *in_RCX;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  string_view input;
  Metadata MVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  FileDescriptorProto file_proto;
  DescriptorPool pool;
  AssertHelper local_1c0;
  Message local_1b8;
  _Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_1b0;
  AssertHelper local_1a8;
  undefined1 local_1a0 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  FileDescriptorProto local_180;
  DescriptorPool local_88;
  
  DescriptorPool::DescriptorPool(&local_88);
  FileDescriptorProto::FileDescriptorProto(&local_180,(Arena *)0x0);
  MVar5 = FileDescriptorProto::GetMetadata
                    ((FileDescriptorProto *)_FileDescriptorProto_default_instance_);
  FileDescriptor::CopyTo((MVar5.descriptor)->file_,&local_180);
  pFVar2 = DescriptorPool::BuildFile(&local_88,&local_180);
  local_1b8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_1b8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,pFVar2 != (FileDescriptor *)0x0);
  local_1b0.
  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                  )(LogMessageData *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a0,(internal *)&local_1b8,
               (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xff0,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
LAB_00593fde:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1b0;
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != &local_190) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1a0._1_7_,local_1a0[0]),local_190._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_1c0.data_._4_4_,(int)local_1c0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c0.data_._4_4_,(int)local_1c0.data_) + 8))();
    }
    local_198 = local_1b0.
                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                ._M_head_impl;
    if (local_1b0.
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl == (LogMessageData *)0x0) goto LAB_00594025;
  }
  else {
    FileDescriptorProto::~FileDescriptorProto(&local_180);
    FileDescriptorProto::FileDescriptorProto(&local_180,(Arena *)0x0);
    MVar5 = Any::GetMetadata((Any *)_Any_default_instance_);
    FileDescriptor::CopyTo((MVar5.descriptor)->file_,&local_180);
    pFVar2 = DescriptorPool::BuildFile(&local_88,&local_180);
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_1b8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,pFVar2 != (FileDescriptor *)0x0);
    local_1b0.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )(LogMessageData *)0x0;
    if (pFVar2 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1a0,(internal *)&local_1b8,
                 (AssertionResult *)"pool.BuildFile(any_proto) != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xff5,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
      goto LAB_00593fde;
    }
    FileDescriptorProto::~FileDescriptorProto(&local_180);
    FileDescriptorProto::FileDescriptorProto(&local_180,(Arena *)0x0);
    MVar5 = proto2_unittest::TestMessageWithCustomOptions::GetMetadata
                      ((TestMessageWithCustomOptions *)
                       proto2_unittest::_TestMessageWithCustomOptions_default_instance_);
    FileDescriptor::CopyTo((MVar5.descriptor)->file_,&local_180);
    pFVar2 = DescriptorPool::BuildFile(&local_88,&local_180);
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_1b8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,pFVar2 != (FileDescriptor *)0x0);
    local_1b0.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )(LogMessageData *)0x0;
    if (pFVar2 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1a0,(internal *)&local_1b8,
                 (AssertionResult *)"pool.BuildFile(file_proto) != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0xffa,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
      goto LAB_00593fde;
    }
    input._M_str = (char *)&local_180;
    input._M_len = (size_t)
                   "name: \"custom_options_import.proto\" package: \"proto2_unittest\" dependency: \"google/protobuf/unittest_custom_options.proto\" message_type {   name: \"Foo\"   options {     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo\"         is_extension: false       }       positive_int_value: 1234     }     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo2\"         is_extension: false       }       positive_int_value: 1234     }     uninterpreted_option {       name {         name_part: \"complex_opt1\"         is_extension: true       }       name {         name_part: \"foo3\"         is_extension: false       }       positive_int_value: 1234     }   } }"
    ;
    bVar1 = TextFormat::ParseFromString((TextFormat *)0x33f,input,in_RCX);
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_1b8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar1);
    local_1b0.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )(LogMessageData *)0x0;
    if (!bVar1) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1a0,(internal *)&local_1b8,
                 (AssertionResult *)
                 "TextFormat::ParseFromString( \"name: \\\"custom_options_import.proto\\\" \" \"package: \\\"proto2_unittest\\\" \" \"dependency: \\\"google/protobuf/unittest_custom_options.proto\\\" \" \"message_type { \" \"  name: \\\"Foo\\\" \" \"  options { \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo2\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"    uninterpreted_option { \" \"      name { \" \"        name_part: \\\"complex_opt1\\\" \" \"        is_extension: true \" \"      } \" \"      name { \" \"        name_part: \\\"foo3\\\" \" \"        is_extension: false \" \"      } \" \"      positive_int_value: 1234 \" \"    } \" \"  } \" \"}\", &file_proto)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x102f,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1a0._1_7_,local_1a0[0]) != &local_190) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_1a0._1_7_,local_1a0[0]),
                        local_190._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_1c0.data_._4_4_,(int)local_1c0.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1c0.data_._4_4_,(int)local_1c0.data_) + 8))();
      }
      if (local_1b0.
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1b0.
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl);
      }
      if (!bVar1) goto LAB_00594025;
    }
    pFVar2 = DescriptorPool::BuildFile(&local_88,&local_180);
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_1b8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,pFVar2 != (FileDescriptor *)0x0);
    local_1b0.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )(LogMessageData *)0x0;
    if (pFVar2 == (FileDescriptor *)0x0) {
      testing::Message::Message((Message *)&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1a0,(internal *)&local_1b8,(AssertionResult *)0x10faf95,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1032,(char *)CONCAT71(local_1a0._1_7_,local_1a0[0]));
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1c0);
      goto LAB_00593fde;
    }
    local_1b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    local_1c0.data_._0_4_ = pFVar2->message_type_count_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_1a0,"1","file->message_type_count()",(int *)&local_1b8,
               (int *)&local_1c0);
    if (local_1a0[0] == (internal)0x0) {
      testing::Message::Message(&local_1b8);
      if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           )local_198._M_head_impl == (LogMessageData *)0x0) {
        pcVar4 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar4 = *(char **)local_198._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1033,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
LAB_005940c4:
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if ((long *)CONCAT44(local_1b8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_1b8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1b8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_1b8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    else {
      if (local_198._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_198._M_head_impl);
      }
      if ((long)pFVar2->message_type_count_ < 1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (0,(long)pFVar2->message_type_count_,"index < message_type_count()")
        ;
      }
      else {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xae7,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1a0);
      }
      local_1b8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0x4d2;
      pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pFVar2->message_types_->options_->field_0)._impl_._extensions_,
                          proto2_unittest::complex_opt1,
                          (MessageLite *)PTR__ComplexOptionType1_default_instance__019a6a28);
      local_1c0.data_._0_4_ = *(int *)&pMVar3[4]._vptr_MessageLite;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_1a0,"1234",
                 "options.GetExtension(proto2_unittest::complex_opt1).foo()",(int *)&local_1b8,
                 (int *)&local_1c0);
      if (local_1a0[0] == (internal)0x0) {
        testing::Message::Message(&local_1b8);
        if (local_198._M_head_impl == (LogMessageData *)0x0) {
          pcVar4 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar4 = *(char **)local_198._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x1036,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        goto LAB_005940c4;
      }
    }
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_198._M_head_impl == (LogMessageData *)0x0) goto LAB_00594025;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_198;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_198._M_head_impl);
LAB_00594025:
  FileDescriptorProto::~FileDescriptorProto(&local_180);
  DescriptorPool::~DescriptorPool(&local_88);
  return;
}

Assistant:

TEST(CustomOptions, MessageOptionThreeFieldsSet) {
  // This tests a bug which previously existed in custom options parsing.  The
  // bug occurred when you defined a custom option with message type and then
  // set three fields of that option on a single definition (see the example
  // below).  The bug is a bit hard to explain, so check the change history if
  // you want to know more.
  DescriptorPool pool;

  {
    FileDescriptorProto file_proto;
    FileDescriptorProto::descriptor()->file()->CopyTo(&file_proto);
    ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);
  }
  {
    FileDescriptorProto any_proto;
    google::protobuf::Any::descriptor()->file()->CopyTo(&any_proto);
    ASSERT_TRUE(pool.BuildFile(any_proto) != nullptr);
  }
  FileDescriptorProto file_proto;
  proto2_unittest::TestMessageWithCustomOptions::descriptor()->file()->CopyTo(
      &file_proto);
  ASSERT_TRUE(pool.BuildFile(file_proto) != nullptr);

  // The following represents the definition:
  //
  //   import "google/protobuf/unittest_custom_options.proto"
  //   package proto2_unittest;
  //   message Foo {
  //     option (complex_opt1).foo  = 1234;
  //     option (complex_opt1).foo2 = 1234;
  //     option (complex_opt1).foo3 = 1234;
  //   }
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"custom_options_import.proto\" "
      "package: \"proto2_unittest\" "
      "dependency: \"google/protobuf/unittest_custom_options.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  options { "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo2\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "    uninterpreted_option { "
      "      name { "
      "        name_part: \"complex_opt1\" "
      "        is_extension: true "
      "      } "
      "      name { "
      "        name_part: \"foo3\" "
      "        is_extension: false "
      "      } "
      "      positive_int_value: 1234 "
      "    } "
      "  } "
      "}",
      &file_proto));

  const FileDescriptor* file = pool.BuildFile(file_proto);
  ASSERT_TRUE(file != nullptr);
  ASSERT_EQ(1, file->message_type_count());

  const MessageOptions& options = file->message_type(0)->options();
  EXPECT_EQ(1234, options.GetExtension(proto2_unittest::complex_opt1).foo());
}